

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

i64 sqlite3VdbeIntValue(Mem *pMem)

{
  ushort uVar1;
  Mem *in_RDI;
  int flags;
  double local_8;
  
  uVar1 = in_RDI->flags;
  if ((uVar1 & 0x24) == 0) {
    if ((uVar1 & 8) == 0) {
      if (((uVar1 & 0x12) == 0) || (in_RDI->z == (char *)0x0)) {
        local_8 = 0.0;
      }
      else {
        local_8 = (double)memIntValue(in_RDI);
      }
    }
    else {
      local_8 = (double)sqlite3RealToI64((in_RDI->u).r);
    }
  }
  else {
    local_8 = (in_RDI->u).r;
  }
  return (i64)local_8;
}

Assistant:

SQLITE_PRIVATE i64 sqlite3VdbeIntValue(const Mem *pMem){
  int flags;
  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  flags = pMem->flags;
  if( flags & (MEM_Int|MEM_IntReal) ){
    testcase( flags & MEM_IntReal );
    return pMem->u.i;
  }else if( flags & MEM_Real ){
    return sqlite3RealToI64(pMem->u.r);
  }else if( (flags & (MEM_Str|MEM_Blob))!=0 && pMem->z!=0 ){
    return memIntValue(pMem);
  }else{
    return 0;
  }
}